

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_class_proto.h
# Opt level: O2

void dukglue::detail::ProtoManager::push_prototype(duk_context *ctx,TypeInfo *check_info)

{
  bool bVar1;
  TypeInfo *info;
  
  bVar1 = find_and_push_prototype(ctx,check_info);
  if (bVar1) {
    return;
  }
  duk_push_object(ctx);
  info = (TypeInfo *)operator_new(0x10);
  (info->index_)._M_target = (check_info->index_)._M_target;
  info->base_ = check_info->base_;
  duk_push_pointer(ctx,info);
  duk_put_prop_string(ctx,-2,anon_var_dwarf_de5b);
  duk_push_object(ctx);
  duk_push_pointer(ctx,info);
  duk_put_prop_string(ctx,-2,anon_var_dwarf_de5b);
  duk_push_c_function(ctx,type_info_finalizer,1);
  duk_set_finalizer(ctx,-2);
  duk_put_prop_string(ctx,-2,anon_var_dwarf_de66);
  register_prototype(ctx,info);
  return;
}

Assistant:

static void push_prototype(duk_context* ctx, const TypeInfo& check_info)
			{
				if (!find_and_push_prototype(ctx, check_info)) {
					// nope, need to create our prototype object
					duk_push_object(ctx);

					// add reference to this class' info object so we can do type checking
					// when trying to pass this object into method calls
					typedef dukglue::detail::TypeInfo TypeInfo;
					TypeInfo* info = new TypeInfo(check_info);

					duk_push_pointer(ctx, info);
					duk_put_prop_string(ctx, -2, "\xFF" "type_info");

					// Clean up the TypeInfo object when this prototype is destroyed.
					// We can't put a finalizer directly on this prototype, because it
					// will be run whenever the wrapper for an object of this class is
					// destroyed; instead, we make a dummy object and put the finalizer
					// on that.
					// If you're memory paranoid: this duplicates the type_info pointer
					// once per registered class. If you don't care about freeing memory
					// during shutdown, you can probably comment out this part.
					duk_push_object(ctx);
					duk_push_pointer(ctx, info);
					duk_put_prop_string(ctx, -2, "\xFF" "type_info");
					duk_push_c_function(ctx, type_info_finalizer, 1);
					duk_set_finalizer(ctx, -2);
					duk_put_prop_string(ctx, -2, "\xFF" "type_info_finalizer");

					// register it in the stash
					register_prototype(ctx, info);
				}
			}